

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddArchitectureFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  char cVar1;
  cmMakefile *pcVar2;
  char *__s;
  pointer pbVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  iterator __begin3;
  pointer pbVar7;
  string deploymentTargetFlagVar;
  string sysrootFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  allocator<char> local_e1;
  char *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  char *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"APPLE",(allocator<char> *)&local_d8);
  bVar4 = cmMakefile::IsOn(pcVar2,&local_98);
  if (bVar4) {
    bVar4 = this->EmitUniversalBinaryFlags;
    std::__cxx11::string::~string((string *)&local_98);
    if (bVar4 == true) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetAppleArchs(target,config,&local_48);
      pcVar2 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_OSX_SYSROOT",(allocator<char> *)&local_d8);
      pcVar5 = cmMakefile::GetDefinition(pcVar2,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else if ((*pcVar5 == '/') && (pcVar5[1] == '\0')) {
        pcVar5 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"CMAKE_",(allocator<char> *)&local_78);
      std::operator+(&local_d8,&local_b8,lang);
      std::operator+(&local_98,&local_d8,"_SYSROOT_FLAG");
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      local_e0 = cmMakefile::GetDefinition(this->Makefile,&local_98);
      pcVar2 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CMAKE_OSX_DEPLOYMENT_TARGET",(allocator<char> *)&local_b8);
      pcVar6 = cmMakefile::GetDefinition(pcVar2,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"CMAKE_",&local_e1);
      std::operator+(&local_b8,&local_78,lang);
      std::operator+(&local_d8,&local_b8,"_OSX_DEPLOYMENT_TARGET_FLAG");
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
      local_58 = cmMakefile::GetDefinition(this->Makefile,&local_d8);
      pbVar3 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = pcVar5;
      if (((local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) && (lang->_M_string_length != 0)) &&
         ((cVar1 = *(lang->_M_dataplus)._M_p,
          pbVar7 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, cVar1 == 'F' || (cVar1 == 'C')))) {
        for (; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1) {
          std::__cxx11::string::append((char *)flags);
          std::__cxx11::string::append((string *)flags);
        }
      }
      __s = local_50;
      pcVar5 = local_58;
      if ((((local_e0 != (char *)0x0) && (*local_e0 != '\0')) && (local_50 != (char *)0x0)) &&
         (*local_50 != '\0')) {
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_e1);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_b8,&this->super_cmOutputConverter,&local_78,SHELL);
        std::__cxx11::string::append((string *)flags);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_78);
      }
      if (((pcVar5 != (char *)0x0) && (pcVar6 != (char *)0x0)) &&
         ((*pcVar5 != '\0' && (*pcVar6 != '\0')))) {
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
      }
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddArchitectureFlags(std::string& flags,
                                            cmGeneratorTarget const* target,
                                            const std::string& lang,
                                            const std::string& config)
{
  // Only add macOS specific flags on Darwin platforms (macOS and iOS):
  if (this->Makefile->IsOn("APPLE") && this->EmitUniversalBinaryFlags) {
    std::vector<std::string> archs;
    target->GetAppleArchs(config, archs);
    const char* sysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    if (sysroot && sysroot[0] == '/' && !sysroot[1]) {
      sysroot = nullptr;
    }
    std::string sysrootFlagVar =
      std::string("CMAKE_") + lang + "_SYSROOT_FLAG";
    const char* sysrootFlag = this->Makefile->GetDefinition(sysrootFlagVar);
    const char* deploymentTarget =
      this->Makefile->GetDefinition("CMAKE_OSX_DEPLOYMENT_TARGET");
    std::string deploymentTargetFlagVar =
      std::string("CMAKE_") + lang + "_OSX_DEPLOYMENT_TARGET_FLAG";
    const char* deploymentTargetFlag =
      this->Makefile->GetDefinition(deploymentTargetFlagVar);
    if (!archs.empty() && !lang.empty() &&
        (lang[0] == 'C' || lang[0] == 'F')) {
      for (std::string const& arch : archs) {
        flags += " -arch ";
        flags += arch;
      }
    }

    if (sysrootFlag && *sysrootFlag && sysroot && *sysroot) {
      flags += " ";
      flags += sysrootFlag;
      flags += " ";
      flags += this->ConvertToOutputFormat(sysroot, SHELL);
    }

    if (deploymentTargetFlag && *deploymentTargetFlag && deploymentTarget &&
        *deploymentTarget) {
      flags += " ";
      flags += deploymentTargetFlag;
      flags += deploymentTarget;
    }
  }
}